

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_shr_slow(JSContext *ctx,JSValue *sp)

{
  JSValue v_00;
  JSValue val;
  int iVar1;
  uint uVar2;
  JSValueUnion *pJVar3;
  long in_RSI;
  JSContext *in_RDI;
  JSValue JVar4;
  uint32_t r;
  uint32_t v2;
  uint32_t v1;
  JSValue op2;
  JSValue op1;
  JSValue v;
  uint32_t *in_stack_ffffffffffffff18;
  JSContext *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  int64_t in_stack_ffffffffffffff30;
  uint uStack_c4;
  byte local_a0;
  uint local_9c;
  JSValueUnion local_60;
  double local_58;
  JSValueUnion local_30;
  double local_28;
  undefined4 uStack_c;
  
  JVar4.u._4_4_ = in_stack_ffffffffffffff2c;
  JVar4.u.int32 = in_stack_ffffffffffffff28;
  JVar4.tag = in_stack_ffffffffffffff30;
  iVar1 = JS_ToUint32Free(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,JVar4);
  if (iVar1 == 0) {
    val.u._4_4_ = in_stack_ffffffffffffff2c;
    val.u.int32 = in_stack_ffffffffffffff28;
    val.tag = in_stack_ffffffffffffff30;
    iVar1 = JS_ToUint32Free(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,val);
    if (iVar1 == 0) {
      uVar2 = local_9c >> (local_a0 & 0x1f);
      pJVar3 = (JSValueUnion *)(in_RSI + -0x20);
      if (uVar2 < 0x80000000) {
        local_30._4_4_ = uStack_c;
        local_30.int32 = uVar2;
        local_28 = 0.0;
      }
      else {
        JVar4 = __JS_NewFloat64(in_RDI,(double)uVar2);
        local_60 = JVar4.u;
        local_30 = local_60;
        local_58 = (double)JVar4.tag;
        local_28 = local_58;
      }
      *pJVar3 = local_30;
      pJVar3[1].float64 = local_28;
      return 0;
    }
  }
  else {
    v_00.u._4_4_ = in_stack_ffffffffffffff2c;
    v_00.u.int32 = in_stack_ffffffffffffff28;
    v_00.tag = in_stack_ffffffffffffff30;
    JS_FreeValue(in_stack_ffffffffffffff20,v_00);
  }
  *(ulong *)(in_RSI + -0x20) = (ulong)uStack_c4 << 0x20;
  *(undefined8 *)(in_RSI + -0x18) = 3;
  *(ulong *)(in_RSI + -0x10) = (ulong)in_stack_ffffffffffffff2c << 0x20;
  *(undefined8 *)(in_RSI + -8) = 3;
  return -1;
}

Assistant:

static no_inline int js_shr_slow(JSContext *ctx, JSValue *sp)
{
    JSValue op1, op2;
    uint32_t v1, v2, r;

    op1 = sp[-2];
    op2 = sp[-1];
    if (unlikely(JS_ToUint32Free(ctx, &v1, op1))) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    if (unlikely(JS_ToUint32Free(ctx, &v2, op2)))
        goto exception;
    r = v1 >> (v2 & 0x1f);
    sp[-2] = JS_NewUint32(ctx, r);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}